

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPIOClass.cpp
# Opt level: O1

int __thiscall GPIOClass::unexport_gpio(GPIOClass *this)

{
  ostream *poVar1;
  int iVar2;
  string unexport_str;
  ofstream unexportgpio;
  long *local_238 [2];
  long local_228 [2];
  long local_218;
  filebuf local_210 [24];
  byte abStack_1f8 [216];
  ios_base local_120 [264];
  
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"/sys/class/gpio/unexport","")
  ;
  std::ofstream::ofstream(&local_218,(char *)local_238[0],_S_out);
  if ((abStack_1f8[*(long *)(local_218 + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_218,(this->gpionum)._M_dataplus._M_p,
               (this->gpionum)._M_string_length);
    iVar2 = 0;
    std::ofstream::close();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," OPERATION FAILED: Unable to unexport GPIO",0x2a);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->gpionum)._M_dataplus._M_p,
                        (this->gpionum)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," .",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    iVar2 = -1;
    std::ostream::flush();
  }
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _connect;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  return iVar2;
}

Assistant:

int GPIOClass::unexport_gpio()
{
    string unexport_str = "/sys/class/gpio/unexport";
    ofstream unexportgpio(unexport_str.c_str()); //Open unexport file
    if (!unexportgpio){
        cout << " OPERATION FAILED: Unable to unexport GPIO"<< this->gpionum <<" ."<< endl;
        return -1;
    }

    unexportgpio << this->gpionum ; //write GPIO number to unexport
    unexportgpio.close(); //close unexport file
    return 0;
}